

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::SeparatedSyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }